

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

void AddNonCompressedBlock
               (ZopfliOptions *options,int final,uchar *in,size_t instart,size_t inend,uchar *bp,
               uchar **out,size_t *outsize)

{
  uchar *puVar1;
  uchar *puVar2;
  void *pvVar3;
  uint uVar4;
  uchar *puVar6;
  uint uVar7;
  undefined4 in_register_00000034;
  ulong uVar8;
  ulong uVar5;
  
  do {
    uVar7 = (int)instart - (int)in;
    if (in + 0xffff <= instart) {
      uVar7 = 0xffff;
    }
    uVar4 = uVar7 & 0xffff;
    uVar5 = (ulong)uVar4;
    puVar6 = in + uVar5;
    AddBit((uint)(instart <= puVar6 && (int)options != 0),(uchar *)inend,(uchar **)bp,(size_t *)out)
    ;
    AddBit(0,(uchar *)inend,(uchar **)bp,(size_t *)out);
    AddBit(0,(uchar *)inend,(uchar **)bp,(size_t *)out);
    *(undefined1 *)inend = 0;
    puVar1 = *out;
    if (((ulong)puVar1 & (ulong)(puVar1 + -1)) == 0) {
      if (puVar1 == (uchar *)0x0) {
        pvVar3 = malloc(1);
      }
      else {
        pvVar3 = realloc(*(void **)bp,(long)puVar1 * 2);
      }
      *(void **)bp = pvVar3;
    }
    (*out)[*(long *)bp] = (uchar)uVar4;
    puVar2 = *out;
    puVar1 = puVar2 + 1;
    *out = puVar1;
    if (((ulong)puVar1 & (ulong)puVar2) == 0) {
      if (puVar1 == (uchar *)0x0) {
        pvVar3 = malloc(1);
      }
      else {
        pvVar3 = realloc(*(void **)bp,(long)puVar1 * 2);
      }
      *(void **)bp = pvVar3;
    }
    (*out)[*(long *)bp] = (uchar)(uVar4 >> 8);
    puVar2 = *out;
    puVar1 = puVar2 + 1;
    *out = puVar1;
    if (((ulong)puVar1 & (ulong)puVar2) == 0) {
      if (puVar1 == (uchar *)0x0) {
        pvVar3 = malloc(1);
      }
      else {
        pvVar3 = realloc(*(void **)bp,(long)puVar1 * 2);
      }
      *(void **)bp = pvVar3;
    }
    (*out)[*(long *)bp] = (uchar)~uVar7;
    puVar2 = *out;
    puVar1 = puVar2 + 1;
    *out = puVar1;
    if (((ulong)puVar1 & (ulong)puVar2) == 0) {
      if (puVar1 == (uchar *)0x0) {
        pvVar3 = malloc(1);
      }
      else {
        pvVar3 = realloc(*(void **)bp,(long)puVar1 * 2);
      }
      *(void **)bp = pvVar3;
    }
    (*out)[*(long *)bp] = (uchar)(~uVar7 >> 8);
    *out = *out + 1;
    if (uVar5 != 0) {
      uVar8 = 0;
      do {
        puVar1 = *out;
        if (((ulong)puVar1 & (ulong)(puVar1 + -1)) == 0) {
          if (puVar1 == (uchar *)0x0) {
            pvVar3 = malloc(1);
          }
          else {
            pvVar3 = realloc(*(void **)bp,(long)puVar1 * 2);
          }
          *(void **)bp = pvVar3;
        }
        (*out)[*(long *)bp] = in[uVar8 + CONCAT44(in_register_00000034,final)];
        *out = *out + 1;
        uVar8 = uVar8 + 1;
      } while (uVar5 != uVar8);
    }
    in = puVar6;
  } while (puVar6 < instart);
  return;
}

Assistant:

static void AddNonCompressedBlock(const ZopfliOptions* options, int final,
                                  const unsigned char* in, size_t instart,
                                  size_t inend,
                                  unsigned char* bp,
                                  unsigned char** out, size_t* outsize) {
  size_t pos = instart;
  (void)options;
  for (;;) {
    size_t i;
    unsigned short blocksize = 65535;
    unsigned short nlen;
    int currentfinal;

    if (pos + blocksize > inend) blocksize = inend - pos;
    currentfinal = pos + blocksize >= inend;

    nlen = ~blocksize;

    AddBit(final && currentfinal, bp, out, outsize);
    /* BTYPE 00 */
    AddBit(0, bp, out, outsize);
    AddBit(0, bp, out, outsize);

    /* Any bits of input up to the next byte boundary are ignored. */
    *bp = 0;

    ZOPFLI_APPEND_DATA(blocksize % 256, out, outsize);
    ZOPFLI_APPEND_DATA((blocksize / 256) % 256, out, outsize);
    ZOPFLI_APPEND_DATA(nlen % 256, out, outsize);
    ZOPFLI_APPEND_DATA((nlen / 256) % 256, out, outsize);

    for (i = 0; i < blocksize; i++) {
      ZOPFLI_APPEND_DATA(in[pos + i], out, outsize);
    }

    if (currentfinal) break;
    pos += blocksize;
  }
}